

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

bool __thiscall MinVR::element::set_comment(element *this,char *the_comment)

{
  char *in_RDI;
  element *in_stack_ffffffffffffffa8;
  string *the_value;
  element *in_stack_ffffffffffffffb8;
  allocator<char> local_31;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  set_name(in_stack_ffffffffffffffa8,in_RDI);
  the_value = (string *)&local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  set_value(in_stack_ffffffffffffffb8,the_value);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator(&local_31);
  in_RDI[0x7a] = '\x01';
  return true;
}

Assistant:

bool element::set_comment(char* the_comment)
{
    set_name("Comment");
    set_value(the_comment);
    is_comment = true;
    return true;
}